

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchChoice.c
# Opt level: O3

int Dch_ObjCheckTfi(Aig_Man_t *p,Aig_Obj_t *pObj,Aig_Obj_t *pRepr)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchChoice.c"
                  ,0x18d,"int Dch_ObjCheckTfi(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  if (((ulong)pRepr & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pRepr)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchChoice.c"
                  ,0x18e,"int Dch_ObjCheckTfi(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  pAVar2 = pRepr;
  if (pRepr != (Aig_Obj_t *)0x0) {
    do {
      pAVar2->field_0x18 = pAVar2->field_0x18 | 0x10;
      if (p->pEquivs == (Aig_Obj_t **)0x0) break;
      pAVar2 = p->pEquivs[pAVar2->Id];
    } while (pAVar2 != (Aig_Obj_t *)0x0);
  }
  Aig_ManIncrementTravId(p);
  iVar1 = Dch_ObjCheckTfi_rec(p,pObj);
  while( true ) {
    if (pRepr == (Aig_Obj_t *)0x0) {
      return iVar1;
    }
    pRepr->field_0x18 = pRepr->field_0x18 & 0xef;
    if (p->pEquivs == (Aig_Obj_t **)0x0) break;
    pRepr = p->pEquivs[pRepr->Id];
  }
  return iVar1;
}

Assistant:

int Dch_ObjCheckTfi( Aig_Man_t * p, Aig_Obj_t * pObj, Aig_Obj_t * pRepr )
{
    Aig_Obj_t * pTemp;
    int RetValue;
    assert( !Aig_IsComplement(pObj) );
    assert( !Aig_IsComplement(pRepr) );
    // mark nodes of the choice node
    for ( pTemp = pRepr; pTemp; pTemp = Aig_ObjEquiv(p, pTemp) )
        pTemp->fMarkA = 1;
    // traverse the new node
    Aig_ManIncrementTravId( p );
    RetValue = Dch_ObjCheckTfi_rec( p, pObj );
    // unmark nodes of the choice node
    for ( pTemp = pRepr; pTemp; pTemp = Aig_ObjEquiv(p, pTemp) )
        pTemp->fMarkA = 0;
    return RetValue;
}